

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_bench.cxx
# Opt level: O3

int raft_bench::worker_func(ThreadArgs *_args)

{
  pthread_mutex_t *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_> *logs;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  shared_ptr<nuraft::buffer> *psVar8;
  ostream *poVar9;
  ostream *poVar10;
  double dVar11;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l;
  ptr<buffer> msg;
  ptr<raft_result> ret;
  allocator_type local_89;
  string local_88;
  shared_ptr<nuraft::buffer> local_68;
  buffer *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  WorkloadGenerator *local_48;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *local_40;
  element_type *local_38;
  
  nuraft::buffer::alloc((buffer *)&local_58,*(size_t *)(*(long *)_args + 0x40));
  iVar3 = 0;
  nuraft::buffer::put(local_58,'\0');
  if (((byte)_args[0x10] & 1) == 0) {
    __mutex = (pthread_mutex_t *)(_args + 0x40);
    local_48 = (WorkloadGenerator *)(_args + 0x20);
    paVar1 = &local_88.field_2;
    do {
      iVar3 = pthread_mutex_lock(__mutex);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      sVar4 = TestSuite::WorkloadGenerator::getNumOpsToDo(local_48);
      pthread_mutex_unlock(__mutex);
      if (sVar4 == 0) {
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
        local_88._M_dataplus._M_p = (pointer)paVar1;
        TestSuite::sleep_ms(1,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
      else {
        lVar5 = std::chrono::_V2::system_clock::now();
        nuraft::buffer::pos(local_58,0);
        logs = *(vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 **)(*(long *)(_args + 8) + 0xb0);
        local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
        local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_50;
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_50->_M_use_count = local_50->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_50->_M_use_count = local_50->_M_use_count + 1;
          }
        }
        __l._M_len = 1;
        __l._M_array = &local_68;
        std::
        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
        vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                *)&local_88,__l,&local_89);
        nuraft::raft_server::append_entries((raft_server *)&stack0xffffffffffffffc0,logs);
        std::
        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
        ~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 *)&local_88);
        if (local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_88._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"rep","");
        lVar6 = std::chrono::_V2::system_clock::now();
        dVar11 = ((double)(lVar6 - lVar5) / 1000000000.0) * 1000000.0;
        uVar7 = (ulong)dVar11;
        LatencyCollector::addLatency
                  ((LatencyCollector *)global_lat,&local_88,
                   (long)(dVar11 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        if (local_40->accepted_ == false) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          poVar9 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_88._M_dataplus._M_p,local_88._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[33m",5);
          lVar5 = *(long *)poVar9;
          *(uint *)(poVar9 + *(long *)(lVar5 + -0x18) + 0x18) =
               *(uint *)(poVar9 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar9 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
          poVar10 = poVar9 + *(long *)(lVar5 + -0x18);
          if (poVar9[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar10);
            poVar10[0xe1] = (ostream)0x1;
          }
          poVar10[0xe0] = (ostream)0x30;
          local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)pthread_self();
          std::_Hash_bytes(&local_68,8,0xc70f6907);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
               *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"worker_func",0xb);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/bench/raft_bench.cxx"
                     ,0x65);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;35m",7);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x133);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"    value of: \x1b[1;34mret->get_accepted()\x1b[0m\n",0x2d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    expected: \x1b[1;32m",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"true",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      actual: \x1b[1;31m",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"false",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
LAB_0017d556:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          TestSuite::failHandler();
          bVar2 = false;
        }
        else {
          psVar8 = nuraft::
                   cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
                   get(local_40);
          if ((psVar8->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
              (element_type *)0x0) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
            std::ostream::put(-0x60);
            poVar9 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"        time: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;30m",7);
            TestSuite::getTimeString_abi_cxx11_();
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_88._M_dataplus._M_p,local_88._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      thread: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[33m",5);
            lVar5 = *(long *)poVar9;
            *(uint *)(poVar9 + *(long *)(lVar5 + -0x18) + 0x18) =
                 *(uint *)(poVar9 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
            *(undefined8 *)(poVar9 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
            poVar10 = poVar9 + *(long *)(lVar5 + -0x18);
            if (poVar9[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
              std::ios::widen((char)poVar10);
              poVar10[0xe1] = (ostream)0x1;
            }
            poVar10[0xe0] = (ostream)0x30;
            local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pthread_self();
            std::_Hash_bytes(&local_68,8,0xc70f6907);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
                 *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          in: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[36m",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"worker_func",0xb);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"()\x1b[0m",6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          at: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[32m",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/bench/raft_bench.cxx"
                       ,0x65);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m:",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;35m",7);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x134);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"    value of: \x1b[1;34mret->get()\x1b[0m\n",0x24);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"    expected: \x1b[1;32m",0x15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"non-NULL",8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"      actual: \x1b[1;31m",0x15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"NULL",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
            goto LAB_0017d556;
          }
          iVar3 = pthread_mutex_lock(__mutex);
          if (iVar3 != 0) {
            std::__throw_system_error(iVar3);
          }
          *(long *)(_args + 0x38) = *(long *)(_args + 0x38) + 1;
          pthread_mutex_unlock(__mutex);
          LOCK();
          *(long *)(_args + 0x18) = *(long *)(_args + 0x18) + 1;
          UNLOCK();
          bVar2 = true;
        }
        if (local_38 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
        }
        if (!bVar2) {
          iVar3 = -1;
          goto LAB_0017d594;
        }
      }
    } while (((byte)_args[0x10] & 1) == 0);
    iVar3 = 0;
  }
LAB_0017d594:
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return iVar3;
}

Assistant:

int worker_func(TestSuite::ThreadArgs* _args) {
    worker_params* args = static_cast<worker_params*>(_args);

    ptr<buffer> msg = buffer::alloc(args->config_.payload_size_);
    msg->put( (byte)0x0 );

    while (!args->stop_signal_) {
        size_t num_ops = 0;
        {   std::lock_guard<std::mutex> l(args->wg_lock_);
            num_ops = args->wg_.getNumOpsToDo();
        }
        if (!num_ops) {
            TestSuite::sleep_ms(1);
            continue;
        }

        TestSuite::Timer timer;

        msg->pos(0);
        ptr<raft_result> ret =
            args->stuff_.raft_instance_->append_entries( {msg} );
        global_lat.addLatency("rep", timer.getTimeUs());

        CHK_TRUE( ret->get_accepted() );
        CHK_NONNULL( ret->get() );

        {   std::lock_guard<std::mutex> l(args->wg_lock_);
            args->wg_.addNumOpsDone(1);
        }
        args->num_ops_done_.fetch_add(1);
    }

    return 0;
}